

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Edition2023InferredFeatures_Test::TestBody
          (FeaturesTest_Edition2023InferredFeatures_Test *this)

{
  Descriptor *pDVar1;
  FileDescriptor *this_00;
  FieldDescriptor *pFVar2;
  ConstType pCVar3;
  char *pcVar4;
  AssertHelper local_168;
  AssertionResult gtest_ar;
  FeatureSet local_150;
  FileDescriptorProto file_proto;
  
  local_150.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x2d3;
  local_150.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0xd7d625;
  ParseTextOrDie::operator_cast_to_FileDescriptorProto(&file_proto,(ParseTextOrDie *)&local_150);
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  pDVar1 = pb::CppFeatures::GetDescriptor();
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,pDVar1->file_);
  local_150.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)
       DescriptorPool::BuildFile
                 (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,&file_proto);
  this_00 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x21af,"pool_.BuildFile(file_proto)",(FileDescriptor **)&local_150);
  pDVar1 = FileDescriptor::message_type(this_00,0);
  pFVar2 = Descriptor::field(pDVar1,0);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_150,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_150,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::cpp);
  local_168.data_._0_4_ = (pCVar3->field_0)._impl_.string_type_;
  testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
            ((internal *)&gtest_ar,
             "GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::STRING",(CppFeatures_StringType *)&local_168,&pb::CppFeatures::STRING
            );
  FeatureSet::~FeatureSet(&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21b4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((FileDescriptor *)local_150.super_Message.super_MessageLite._vptr_MessageLite !=
        (FileDescriptor *)0x0) {
      (**(code **)((long)*local_150.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pFVar2 = Descriptor::field(pDVar1,1);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_150,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_150,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::cpp);
  local_168.data_._0_4_ = (pCVar3->field_0)._impl_.string_type_;
  testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
            ((internal *)&gtest_ar,
             "GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::CORD",(CppFeatures_StringType *)&local_168,&pb::CppFeatures::CORD);
  FeatureSet::~FeatureSet(&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21b7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((FileDescriptor *)local_150.super_Message.super_MessageLite._vptr_MessageLite !=
        (FileDescriptor *)0x0) {
      (**(code **)((long)*local_150.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pFVar2 = Descriptor::field(pDVar1,3);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_150,pFVar2);
  pCVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (&local_150,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::cpp);
  local_168.data_._0_4_ = (pCVar3->field_0)._impl_.string_type_;
  testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
            ((internal *)&gtest_ar,
             "GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type()",
             "pb::CppFeatures::VIEW",(CppFeatures_StringType *)&local_168,&pb::CppFeatures::VIEW);
  FeatureSet::~FeatureSet(&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21ba,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((FileDescriptor *)local_150.super_Message.super_MessageLite._vptr_MessageLite !=
        (FileDescriptor *)0x0) {
      (**(code **)((long)*local_150.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

TEST_F(FeaturesTest, Edition2023InferredFeatures) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "Foo"
      field { name: "str" number: 1 label: LABEL_OPTIONAL type: TYPE_STRING }
      field {
        name: "cord"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 3
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
      field {
        name: "view"
        number: 4
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options {
          features {
            [pb.cpp] { string_type: VIEW }
          }
        }
      }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);

  EXPECT_EQ(
      GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::STRING);
  EXPECT_EQ(
      GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::CORD);
  EXPECT_EQ(
      GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::VIEW);
}